

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O1

unique_ptr<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>_> __thiscall
wabt::MakeUnique<wasm_tabletype_t,wabt::interp::TableType&>(wabt *this,TableType *args)

{
  undefined2 uVar1;
  ExternKind EVar2;
  undefined4 uVar3;
  ulong uVar4;
  uint64_t uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  
  puVar6 = (undefined8 *)operator_new(0x20);
  EVar2 = (args->super_ExternType).kind;
  uVar3 = *(undefined4 *)&(args->super_ExternType).field_0xc;
  uVar4 = (args->limits).initial;
  uVar5 = (args->limits).max;
  uVar1 = *(undefined2 *)&(args->limits).has_max;
  puVar7 = (undefined8 *)operator_new(0x28);
  *(ExternKind *)(puVar7 + 1) = EVar2;
  *puVar7 = &PTR__ExternType_001ea8f0;
  *(undefined4 *)((long)puVar7 + 0xc) = uVar3;
  puVar7[2] = uVar4;
  puVar7[3] = uVar5;
  *(undefined2 *)(puVar7 + 4) = uVar1;
  puVar6[1] = puVar7;
  *puVar6 = &PTR__wasm_externtype_t_001eac88;
  *(undefined4 *)(puVar6 + 2) = uVar3;
  *(ulong *)((long)puVar6 + 0x14) = uVar4 & 0xffffffff | uVar5 << 0x20;
  *(undefined8 **)this = puVar6;
  return (__uniq_ptr_data<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_tabletype_t,_std::default_delete<wasm_tabletype_t>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}